

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::RandomOrderTexImageCubeCase::RandomOrderTexImageCubeCase
          (RandomOrderTexImageCubeCase *this,Context *context,char *name,char *desc,
          deUint32 internalFormat,int size)

{
  int iVar1;
  TransferFormat TVar2;
  deUint32 local_40;
  deUint32 dStack_3c;
  TransferFormat fmt;
  int size_local;
  deUint32 internalFormat_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  RandomOrderTexImageCubeCase *this_local;
  
  fmt = (TransferFormat)glu::mapGLInternalFormat(internalFormat);
  iVar1 = deLog2Floor32(size);
  TextureCubeSpecCase::TextureCubeSpecCase
            (&this->super_TextureCubeSpecCase,context,name,desc,(TextureFormat *)&fmt,size,iVar1 + 1
            );
  (this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__RandomOrderTexImageCubeCase_01598660;
  this->m_internalFormat = internalFormat;
  this->m_format = 0;
  this->m_dataType = 0;
  TVar2 = glu::getTransferFormat((this->super_TextureCubeSpecCase).m_texFormat);
  local_40 = TVar2.format;
  this->m_format = local_40;
  dStack_3c = TVar2.dataType;
  this->m_dataType = dStack_3c;
  return;
}

Assistant:

RandomOrderTexImageCubeCase (Context& context, const char* name, const char* desc, deUint32 internalFormat, int size)
		: TextureCubeSpecCase	(context, name, desc, glu::mapGLInternalFormat(internalFormat), size, deLog2Floor32(size)+1)
		, m_internalFormat		(internalFormat)
		, m_format				(GL_NONE)
		, m_dataType			(GL_NONE)
	{
		glu::TransferFormat fmt = glu::getTransferFormat(m_texFormat);
		m_format	= fmt.format;
		m_dataType	= fmt.dataType;
	}